

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miam-core.c
# Opt level: O0

void la_miam_core_v1_data_format_json(la_vstring *vstr,void *data)

{
  _Bool _Var1;
  uint uVar2;
  la_vstring *in_RSI;
  char *in_RDI;
  la_vstring *unaff_retaddr;
  la_miam_core_v1_data_pdu *pdu;
  undefined4 in_stack_ffffffffffffffd8;
  uint32_t in_stack_ffffffffffffffdc;
  undefined1 in_stack_ffffffffffffffe0;
  undefined1 in_stack_ffffffffffffffe1;
  undefined1 in_stack_ffffffffffffffe2;
  undefined1 in_stack_ffffffffffffffe3;
  undefined1 in_stack_ffffffffffffffe4;
  undefined1 in_stack_ffffffffffffffe5;
  undefined1 in_stack_ffffffffffffffe6;
  undefined1 in_stack_ffffffffffffffe7;
  la_vstring *vstr_00;
  
  if ((in_RSI->allocated_size & 0xffff) == 0) {
    vstr_00 = in_RSI;
    la_json_append_int64
              ((la_vstring *)
               CONCAT17(in_stack_ffffffffffffffe7,
                        CONCAT16(in_stack_ffffffffffffffe6,
                                 CONCAT15(in_stack_ffffffffffffffe5,
                                          CONCAT14(in_stack_ffffffffffffffe4,
                                                   CONCAT13(in_stack_ffffffffffffffe3,
                                                            CONCAT12(in_stack_ffffffffffffffe2,
                                                                     CONCAT11(
                                                  in_stack_ffffffffffffffe1,
                                                  in_stack_ffffffffffffffe0))))))),
               (char *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),0x17e6f8);
    la_json_append_string(unaff_retaddr,in_RDI,(char *)vstr_00);
    la_json_append_int64
              ((la_vstring *)
               CONCAT17(in_stack_ffffffffffffffe7,
                        CONCAT16(in_stack_ffffffffffffffe6,
                                 CONCAT15(in_stack_ffffffffffffffe5,
                                          CONCAT14(in_stack_ffffffffffffffe4,
                                                   CONCAT13(in_stack_ffffffffffffffe3,
                                                            CONCAT12(in_stack_ffffffffffffffe2,
                                                                     CONCAT11(
                                                  in_stack_ffffffffffffffe1,
                                                  in_stack_ffffffffffffffe0))))))),
               (char *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),0x17e72e);
    la_json_append_bool((la_vstring *)
                        CONCAT17(in_stack_ffffffffffffffe7,
                                 CONCAT16(in_stack_ffffffffffffffe6,
                                          CONCAT15(in_stack_ffffffffffffffe5,
                                                   CONCAT14(in_stack_ffffffffffffffe4,
                                                            CONCAT13(in_stack_ffffffffffffffe3,
                                                                     CONCAT12(
                                                  in_stack_ffffffffffffffe2,
                                                  CONCAT11(in_stack_ffffffffffffffe1,
                                                           in_stack_ffffffffffffffe0))))))),
                        (char *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),false)
    ;
    la_json_append_int64
              ((la_vstring *)
               CONCAT17(in_stack_ffffffffffffffe7,
                        CONCAT16(in_stack_ffffffffffffffe6,
                                 CONCAT15(in_stack_ffffffffffffffe5,
                                          CONCAT14(in_stack_ffffffffffffffe4,
                                                   CONCAT13(in_stack_ffffffffffffffe3,
                                                            CONCAT12(in_stack_ffffffffffffffe2,
                                                                     CONCAT11(
                                                  in_stack_ffffffffffffffe1,
                                                  in_stack_ffffffffffffffe0))))))),
               (char *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),0x17e76b);
    la_json_append_int64
              ((la_vstring *)
               CONCAT17(in_stack_ffffffffffffffe7,
                        CONCAT16(in_stack_ffffffffffffffe6,
                                 CONCAT15(in_stack_ffffffffffffffe5,
                                          CONCAT14(in_stack_ffffffffffffffe4,
                                                   CONCAT13(in_stack_ffffffffffffffe3,
                                                            CONCAT12(in_stack_ffffffffffffffe2,
                                                                     CONCAT11(
                                                  in_stack_ffffffffffffffe1,
                                                  in_stack_ffffffffffffffe0))))))),
               (char *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),0x17e787);
    la_json_append_int64
              ((la_vstring *)
               CONCAT17(in_stack_ffffffffffffffe7,
                        CONCAT16(in_stack_ffffffffffffffe6,
                                 CONCAT15(in_stack_ffffffffffffffe5,
                                          CONCAT14(in_stack_ffffffffffffffe4,
                                                   CONCAT13(in_stack_ffffffffffffffe3,
                                                            CONCAT12(in_stack_ffffffffffffffe2,
                                                                     CONCAT11(
                                                  in_stack_ffffffffffffffe1,
                                                  in_stack_ffffffffffffffe0))))))),
               (char *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),0x17e7a3);
    uVar2 = (uint)*(byte *)((long)&in_RSI[1].allocated_size + 3);
    if (uVar2 < 3) {
      la_json_object_start
                ((la_vstring *)
                 CONCAT17(in_stack_ffffffffffffffe7,
                          CONCAT16(in_stack_ffffffffffffffe6,
                                   CONCAT15(in_stack_ffffffffffffffe5,
                                            CONCAT14(in_stack_ffffffffffffffe4,
                                                     CONCAT13(in_stack_ffffffffffffffe3,
                                                              CONCAT12(in_stack_ffffffffffffffe2,
                                                                       CONCAT11(
                                                  in_stack_ffffffffffffffe1,
                                                  in_stack_ffffffffffffffe0))))))),
                 (char *)CONCAT44(in_stack_ffffffffffffffdc,uVar2));
      in_stack_ffffffffffffffe5 = (undefined1)in_RSI[1].len;
      in_stack_ffffffffffffffe6 = *(undefined1 *)((long)&in_RSI[1].len + 1);
      in_stack_ffffffffffffffe7 = 0;
      la_json_append_string(unaff_retaddr,in_RDI,(char *)vstr_00);
      if ((*(char *)((long)&in_RSI[1].allocated_size + 3) == '\x01') ||
         (*(char *)((long)&in_RSI[1].allocated_size + 3) == '\x02')) {
        in_stack_ffffffffffffffe2 = *(undefined1 *)((long)&in_RSI[1].len + 2);
        in_stack_ffffffffffffffe3 = *(undefined1 *)((long)&in_RSI[1].len + 3);
        in_stack_ffffffffffffffe4 = 0;
        la_json_append_string(unaff_retaddr,in_RDI,(char *)vstr_00);
      }
      if (*(char *)((long)&in_RSI[1].allocated_size + 3) == '\x02') {
        in_stack_ffffffffffffffdc =
             CONCAT13(*(undefined1 *)((long)&in_RSI[1].len + 4),(int3)in_stack_ffffffffffffffdc);
        in_stack_ffffffffffffffe0 = *(undefined1 *)((long)&in_RSI[1].len + 5);
        in_stack_ffffffffffffffe1 = 0;
        la_json_append_string(unaff_retaddr,in_RDI,(char *)vstr_00);
      }
    }
    else if (uVar2 == 3) {
      la_json_object_start
                ((la_vstring *)
                 CONCAT17(in_stack_ffffffffffffffe7,
                          CONCAT16(in_stack_ffffffffffffffe6,
                                   CONCAT15(in_stack_ffffffffffffffe5,
                                            CONCAT14(in_stack_ffffffffffffffe4,
                                                     CONCAT13(in_stack_ffffffffffffffe3,
                                                              CONCAT12(in_stack_ffffffffffffffe2,
                                                                       CONCAT11(
                                                  in_stack_ffffffffffffffe1,
                                                  in_stack_ffffffffffffffe0))))))),
                 (char *)CONCAT44(in_stack_ffffffffffffffdc,3));
      la_json_append_string(unaff_retaddr,in_RDI,(char *)vstr_00);
    }
    else {
      la_json_object_start
                ((la_vstring *)
                 CONCAT17(in_stack_ffffffffffffffe7,
                          CONCAT16(in_stack_ffffffffffffffe6,
                                   CONCAT15(in_stack_ffffffffffffffe5,
                                            CONCAT14(in_stack_ffffffffffffffe4,
                                                     CONCAT13(in_stack_ffffffffffffffe3,
                                                              CONCAT12(in_stack_ffffffffffffffe2,
                                                                       CONCAT11(
                                                  in_stack_ffffffffffffffe1,
                                                  in_stack_ffffffffffffffe0))))))),
                 (char *)CONCAT44(in_stack_ffffffffffffffdc,uVar2));
    }
    la_json_object_start
              ((la_vstring *)
               CONCAT17(in_stack_ffffffffffffffe7,
                        CONCAT16(in_stack_ffffffffffffffe6,
                                 CONCAT15(in_stack_ffffffffffffffe5,
                                          CONCAT14(in_stack_ffffffffffffffe4,
                                                   CONCAT13(in_stack_ffffffffffffffe3,
                                                            CONCAT12(in_stack_ffffffffffffffe2,
                                                                     CONCAT11(
                                                  in_stack_ffffffffffffffe1,
                                                  in_stack_ffffffffffffffe0))))))),
               (char *)CONCAT44(in_stack_ffffffffffffffdc,uVar2));
    if (in_RSI->str != (char *)0x0) {
      _Var1 = is_printable((uint8_t *)in_RSI->str,*(uint32_t *)((long)&in_RSI->len + 4));
      if (_Var1) {
        la_json_append_string(unaff_retaddr,in_RDI,(char *)vstr_00);
      }
      else {
        la_json_append_octet_string
                  (vstr_00,(char *)in_RSI,
                   (uint8_t *)
                   CONCAT17(in_stack_ffffffffffffffe7,
                            CONCAT16(in_stack_ffffffffffffffe6,
                                     CONCAT15(in_stack_ffffffffffffffe5,
                                              CONCAT14(in_stack_ffffffffffffffe4,
                                                       CONCAT13(in_stack_ffffffffffffffe3,
                                                                CONCAT12(in_stack_ffffffffffffffe2,
                                                                         CONCAT11(
                                                  in_stack_ffffffffffffffe1,
                                                  in_stack_ffffffffffffffe0))))))),
                   CONCAT44(in_stack_ffffffffffffffdc,uVar2));
      }
    }
    if ((in_RSI->allocated_size & 0xffff0000) != 0) {
      la_miam_errors_format_json
                ((la_vstring *)
                 CONCAT17(in_stack_ffffffffffffffe7,
                          CONCAT16(in_stack_ffffffffffffffe6,
                                   CONCAT15(in_stack_ffffffffffffffe5,
                                            CONCAT14(in_stack_ffffffffffffffe4,
                                                     CONCAT13(in_stack_ffffffffffffffe3,
                                                              CONCAT12(in_stack_ffffffffffffffe2,
                                                                       CONCAT11(
                                                  in_stack_ffffffffffffffe1,
                                                  in_stack_ffffffffffffffe0))))))),
                 in_stack_ffffffffffffffdc);
    }
    la_json_object_end((la_vstring *)0x17e986);
    la_json_object_end((la_vstring *)0x17e990);
  }
  else {
    la_miam_errors_format_json
              ((la_vstring *)
               CONCAT17(in_stack_ffffffffffffffe7,
                        CONCAT16(in_stack_ffffffffffffffe6,
                                 CONCAT15(in_stack_ffffffffffffffe5,
                                          CONCAT14(in_stack_ffffffffffffffe4,
                                                   CONCAT13(in_stack_ffffffffffffffe3,
                                                            CONCAT12(in_stack_ffffffffffffffe2,
                                                                     CONCAT11(
                                                  in_stack_ffffffffffffffe1,
                                                  in_stack_ffffffffffffffe0))))))),
               in_stack_ffffffffffffffdc);
  }
  return;
}

Assistant:

static void la_miam_core_v1_data_format_json(la_vstring *vstr, void const *data) {
	la_assert(vstr != NULL);
	la_assert(data != NULL);

	la_miam_core_v1_data_pdu const *pdu = data;
	if(pdu->err & LA_MIAM_ERR_HDR) {
		la_miam_errors_format_json(vstr, pdu->err & LA_MIAM_ERR_HDR);
		return;
	}
	la_json_append_int64(vstr, "pdu_len", pdu->pdu_len);
	la_json_append_string(vstr, "aircraft_id", pdu->aircraft_id);
	la_json_append_int64(vstr, "msg_num", pdu->msg_num);
	la_json_append_bool(vstr, "ack_required", pdu->ack_option == 1 ? true : false);
	la_json_append_int64(vstr, "compression", pdu->compression);
	la_json_append_int64(vstr, "encoding", pdu->encoding);
	la_json_append_int64(vstr, "app_type", pdu->app_type);

	switch(pdu->app_type) {
		case LA_MIAM_CORE_V1_APP_ACARS_2CHAR:
		case LA_MIAM_CORE_V1_APP_ACARS_4CHAR:
		case LA_MIAM_CORE_V1_APP_ACARS_6CHAR:
			la_json_object_start(vstr, "acars");
			la_json_append_string(vstr, "label",
					(char const *)(&((char[]){pdu->app_id[0], pdu->app_id[1], '\0'})));
			if(pdu->app_type == LA_MIAM_CORE_V1_APP_ACARS_4CHAR ||
					pdu->app_type == LA_MIAM_CORE_V1_APP_ACARS_6CHAR) {
				la_json_append_string(vstr, "sublabel",
						(char const *)(&((char[]){pdu->app_id[2], pdu->app_id[3], '\0'})));

			}
			if(pdu->app_type == LA_MIAM_CORE_V1_APP_ACARS_6CHAR) {
				la_json_append_string(vstr, "mfi",
						(char const *)(&((char[]){pdu->app_id[4], pdu->app_id[5], '\0'})));
			}
			break;
		case LA_MIAM_CORE_V1_APP_NONACARS_6CHAR:
			la_json_object_start(vstr, "non_acars");
			la_json_append_string(vstr, "app_id", pdu->app_id);
			break;
		default:
			la_json_object_start(vstr, "unknown_payload_type");
			break;
	}
	la_json_object_start(vstr, "message");
	if(pdu->data != NULL) {
		if(is_printable(pdu->data, pdu->data_len)) {
			la_json_append_string(vstr, "text", (char *)pdu->data);
		} else {
			la_json_append_octet_string(vstr, "octet_string",
					(uint8_t *)pdu->data, pdu->data_len);
		}
	}
	if(pdu->err & LA_MIAM_ERR_BODY) {
		la_miam_errors_format_json(vstr, pdu->err & LA_MIAM_ERR_BODY);
	}
	la_json_object_end(vstr);   // message
	la_json_object_end(vstr);   // acars / non_acars / unknown_payload_type
}